

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

QMimeData * __thiscall QTableModel::mimeData(QTableModel *this,QModelIndexList *indexes)

{
  long *plVar1;
  QMimeData *pQVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QList<QTableWidgetItem_*> local_58;
  QTableWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QTableWidgetItem **)0x0;
  local_58.d.size = 0;
  uVar4 = (uint)(indexes->d).size;
  QList<QTableWidgetItem_*>::reserve(&local_58,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    lVar3 = 0;
    do {
      local_40 = item(this,(QModelIndex *)((long)&((indexes->d).ptr)->r + lVar3));
      QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                ((QPodArrayOps<QTableWidgetItem*> *)&local_58,local_58.d.size,&local_40);
      QList<QTableWidgetItem_*>::end(&local_58);
      lVar3 = lVar3 + 0x18;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  plVar1 = (long *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  if (plVar1 == (long *)0x0) {
    pQVar2 = (QMimeData *)0x0;
  }
  else {
    pQVar2 = (QMimeData *)(**(code **)(*plVar1 + 0x308))(plVar1,&local_58);
  }
  QList<QModelIndex>::clear(&this->cachedIndexes);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTableModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTableWidgetItem*> items;
    const int indexesCount = indexes.size();
    items.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        items << item(indexes.at(i));
    const QTableWidget *view = this->view();

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = (view ? view->mimeData(items) : nullptr);
    cachedIndexes.clear();
    return mimeData;
}